

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

void opj_dwt_encode_1(OPJ_INT32 *a,OPJ_INT32 dn,OPJ_INT32 sn,OPJ_INT32 cas)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  
  if (cas == 0) {
    if (0 < dn || 1 < sn) {
      lVar2 = (long)(sn * 2 + -2);
      lVar12 = 0;
      uVar3 = 0;
      if (0 < dn) {
        uVar3 = (ulong)(uint)dn;
      }
      uVar10 = 0;
      while (uVar3 != uVar10) {
        lVar9 = lVar2;
        if ((long)uVar10 < (long)sn) {
          lVar9 = lVar12;
        }
        lVar12 = lVar12 + 2;
        lVar11 = lVar2;
        if ((int)(uVar10 + 1) < sn) {
          lVar11 = lVar12;
        }
        a[uVar10 * 2 + 1] = a[uVar10 * 2 + 1] - (a[lVar11] + a[lVar9] >> 1);
        uVar10 = uVar10 + 1;
      }
      uVar1 = 0xffffffff;
      lVar2 = (long)(dn * 2 + -1);
      uVar10 = 0;
      uVar3 = (ulong)(uint)sn;
      if (sn < 1) {
        uVar3 = uVar10;
      }
      lVar12 = 1;
      for (; uVar3 != uVar10; uVar10 = uVar10 + 1) {
        piVar5 = a + 1;
        if ((uVar10 != 0) && (piVar5 = a + lVar2, (long)uVar10 <= (long)dn)) {
          piVar5 = a + uVar1;
        }
        lVar9 = lVar2;
        if ((long)uVar10 < (long)dn) {
          lVar9 = lVar12;
        }
        a[uVar10 * 2] = a[uVar10 * 2] + (*piVar5 + a[lVar9] + 2 >> 2);
        uVar1 = uVar1 + 2;
        lVar12 = lVar12 + 2;
      }
    }
  }
  else if (dn == 1 && sn == 0) {
    *a = *a << 1;
  }
  else {
    uVar1 = 0xffffffff;
    lVar2 = (long)(sn * 2 + -1);
    uVar10 = 0;
    uVar3 = 0;
    if (0 < dn) {
      uVar3 = (ulong)(uint)dn;
    }
    lVar12 = 1;
    for (; uVar3 != uVar10; uVar10 = uVar10 + 1) {
      lVar9 = lVar2;
      if ((long)uVar10 < (long)sn) {
        lVar9 = lVar12;
      }
      piVar5 = a + 1;
      if ((uVar10 != 0) && (piVar5 = a + lVar2, (long)uVar10 <= (long)sn)) {
        piVar5 = a + uVar1;
      }
      a[uVar10 * 2] = a[uVar10 * 2] - (a[lVar9] + *piVar5 >> 1);
      uVar1 = uVar1 + 2;
      lVar12 = lVar12 + 2;
    }
    uVar10 = (ulong)(dn * 2 + -2);
    uVar6 = 0;
    uVar3 = (ulong)(uint)sn;
    if (sn < 1) {
      uVar3 = uVar6;
    }
    uVar7 = 0;
    while (uVar3 != uVar7) {
      uVar8 = uVar10;
      if ((long)uVar7 < (long)dn) {
        uVar8 = uVar6;
      }
      uVar6 = uVar6 + 2;
      uVar4 = uVar10;
      if ((int)(uVar7 + 1) < dn) {
        uVar4 = uVar6;
      }
      a[uVar7 * 2 + 1] = a[uVar7 * 2 + 1] + (a[uVar8] + a[uVar4] + 2 >> 2);
      uVar7 = uVar7 + 1;
    }
  }
  return;
}

Assistant:

static void opj_dwt_encode_1(OPJ_INT32 *a, OPJ_INT32 dn, OPJ_INT32 sn,
                             OPJ_INT32 cas)
{
    OPJ_INT32 i;

    if (!cas) {
        if ((dn > 0) || (sn > 1)) { /* NEW :  CASE ONE ELEMENT */
            for (i = 0; i < dn; i++) {
                OPJ_D(i) -= (OPJ_S_(i) + OPJ_S_(i + 1)) >> 1;
            }
            for (i = 0; i < sn; i++) {
                OPJ_S(i) += (OPJ_D_(i - 1) + OPJ_D_(i) + 2) >> 2;
            }
        }
    } else {
        if (!sn && dn == 1) {       /* NEW :  CASE ONE ELEMENT */
            OPJ_S(0) *= 2;
        } else {
            for (i = 0; i < dn; i++) {
                OPJ_S(i) -= (OPJ_DD_(i) + OPJ_DD_(i - 1)) >> 1;
            }
            for (i = 0; i < sn; i++) {
                OPJ_D(i) += (OPJ_SS_(i) + OPJ_SS_(i + 1) + 2) >> 2;
            }
        }
    }
}